

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  uint32_t *puVar2;
  size_t __n;
  LRUHandle *pLVar3;
  bool bVar4;
  uint32_t hash;
  uint uVar5;
  int iVar6;
  uint uVar7;
  LRUHandle *pLVar8;
  LRUHandle **ppLVar9;
  Mutex *__mutex;
  LRUCache *this_01;
  Slice local_40;
  
  hash = Hash(key->data_,key->size_,0);
  uVar5 = hash >> 0x1c;
  __mutex = &this->shard_[uVar5].mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  this_01 = this->shard_ + uVar5;
  __n = key->size_;
  pLVar8 = (LRUHandle *)malloc(__n + 0x47);
  pLVar8->value = value;
  pLVar8->deleter = deleter;
  pLVar8->charge = charge;
  pLVar8->key_length = __n;
  pLVar8->hash = hash;
  pLVar8->in_cache = false;
  pLVar8->refs = 1;
  memcpy(pLVar8->key_data,key->data_,__n);
  if (this_01->capacity_ == 0) {
    pLVar8->next = (LRUHandle *)0x0;
  }
  else {
    pLVar8->refs = 2;
    pLVar8->in_cache = true;
    pLVar8->next = &this->shard_[uVar5].in_use_;
    pLVar3 = this->shard_[uVar5].in_use_.prev;
    pLVar8->prev = pLVar3;
    pLVar3->next = pLVar8;
    pLVar3 = pLVar8->next;
    pLVar3->prev = pLVar8;
    psVar1 = &this->shard_[uVar5].usage_;
    *psVar1 = *psVar1 + charge;
    if (pLVar3 == pLVar8) goto LAB_00149bbd;
    this_00 = &this->shard_[uVar5].table_;
    local_40.data_ = pLVar8->key_data;
    local_40.size_ = __n;
    ppLVar9 = HandleTable::FindPointer(this_00,&local_40,hash);
    pLVar3 = *ppLVar9;
    if (pLVar3 == (LRUHandle *)0x0) {
      pLVar8->next_hash = (LRUHandle *)0x0;
      *ppLVar9 = pLVar8;
      uVar7 = this->shard_[uVar5].table_.elems_ + 1;
      this->shard_[uVar5].table_.elems_ = uVar7;
      if (this->shard_[uVar5].table_.length_ < uVar7) {
        HandleTable::Resize(this_00);
      }
    }
    else {
      pLVar8->next_hash = pLVar3->next_hash;
      *ppLVar9 = pLVar8;
    }
    LRUCache::FinishErase(this_01,pLVar3);
  }
  while( true ) {
    if ((this->shard_[uVar5].usage_ <= this_01->capacity_) ||
       (pLVar3 = this->shard_[uVar5].lru_.next, pLVar3 == &this->shard_[uVar5].lru_)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)pLVar8;
    }
    if (pLVar3->refs != 1) {
      __assert_fail("old->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0x128,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
    if (pLVar3->next == pLVar3) break;
    local_40.data_ = pLVar3->key_data;
    local_40.size_ = pLVar3->key_length;
    ppLVar9 = HandleTable::FindPointer(&this->shard_[uVar5].table_,&local_40,pLVar3->hash);
    pLVar3 = *ppLVar9;
    if (pLVar3 != (LRUHandle *)0x0) {
      *ppLVar9 = pLVar3->next_hash;
      puVar2 = &this->shard_[uVar5].table_.elems_;
      *puVar2 = *puVar2 - 1;
    }
    bVar4 = LRUCache::FinishErase(this_01,pLVar3);
    if (!bVar4) {
      __assert_fail("erased",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,299,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
  }
LAB_00149bbd:
  __assert_fail("next != this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                ,0x3b,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }